

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

shared_ptr<kratos::TaskStmtBlock> __thiscall
kratos::Generator::task(Generator *this,string *func_name)

{
  bool bVar1;
  size_type sVar2;
  key_type *in_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar3 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_bool>
  pVar4;
  shared_ptr<kratos::TaskStmtBlock> sVar5;
  format_args args;
  string_view format_str;
  uint local_ec;
  string *local_e8;
  undefined1 local_de;
  undefined1 local_dd;
  string local_d0;
  _Self local_b0;
  _Self local_a8;
  key_type *local_a0;
  string *func_name_local;
  Generator *this_local;
  shared_ptr<kratos::TaskStmtBlock> *p;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_a0 = in_RDX;
  func_name_local = func_name;
  this_local = this;
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
               *)((long)&func_name[0x1d].field_2 + 8),in_RDX);
  local_b0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
              *)((long)&func_name[0x1d].field_2 + 8));
  bVar1 = std::operator!=(&local_a8,&local_b0);
  if (bVar1) {
    local_dd = 1;
    auVar3 = __cxa_allocate_exception(0x10);
    local_38 = &local_d0;
    local_40 = "function {0} already exists";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_a0;
    local_68.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string_const&,char[28],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"function {0} already exists",(v7 *)local_a0,auVar3._8_8_,
                    (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                    "function {0} already exists");
    local_50 = &local_68;
    local_78 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&p;
    local_30 = local_50;
    local_20 = local_50;
    local_10 = local_50;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_50->string);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_80.values_;
    format_str.size_ = (size_t)p;
    format_str.data_ = (char *)local_78.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_d0,(detail *)local_78.data_,format_str,args);
    UserException::UserException(auVar3._0_8_,&local_d0);
    local_dd = 0;
    __cxa_throw(auVar3._0_8_,&UserException::typeinfo,UserException::~UserException);
  }
  local_de = 0;
  local_e8 = func_name;
  std::make_shared<kratos::TaskStmtBlock,kratos::Generator*,std::__cxx11::string_const&>
            ((Generator **)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
                  *)((long)&func_name[0x1d].field_2 + 8));
  local_ec = (uint)sVar2;
  std::
  map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
  ::emplace<unsigned_int,std::__cxx11::string_const&>
            ((map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
              *)&func_name[0x1f]._M_string_length,&local_ec,local_a0);
  pVar4 = std::
          map<std::__cxx11::string,std::shared_ptr<kratos::FunctionStmtBlock>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>>
          ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::TaskStmtBlock>&>
                    ((map<std::__cxx11::string,std::shared_ptr<kratos::FunctionStmtBlock>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>>
                      *)(func_name[0x1d].field_2._M_local_buf + 8),local_a0,
                     (shared_ptr<kratos::TaskStmtBlock> *)this);
  sVar5.super___shared_ptr<kratos::TaskStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       pVar4._8_8_;
  sVar5.super___shared_ptr<kratos::TaskStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::TaskStmtBlock>)
         sVar5.super___shared_ptr<kratos::TaskStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TaskStmtBlock> Generator::task(const std::string &func_name) {
    if (funcs_.find(func_name) != funcs_.end())
        throw UserException(::format("function {0} already exists", func_name));
    auto p = std::make_shared<TaskStmtBlock>(this, func_name);
    func_index_.emplace(static_cast<uint32_t>(funcs_.size()), func_name);
    funcs_.emplace(func_name, p);
    return p;
}